

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O3

fy_token * fy_token_vcreate(fy_token_type type,__va_list_tag *ap)

{
  size_t *psVar1;
  fy_token *pfVar2;
  fy_input *pfVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  fy_token *fyt;
  ulong uVar9;
  long *plVar10;
  uint *puVar11;
  
  if ((FYTT_INPUT_MARKER < type) || (fyt = (fy_token *)calloc(1,0x130), fyt == (fy_token *)0x0)) {
    fyt = (fy_token *)0x0;
    goto LAB_0013b89f;
  }
  fyt->refs = 1;
  fyt->type = type;
  uVar9 = (ulong)ap->gp_offset;
  if (uVar9 < 0x29) {
    plVar10 = (long *)(uVar9 + (long)ap->reg_save_area);
    uVar8 = ap->gp_offset + 8;
    uVar9 = (ulong)uVar8;
    ap->gp_offset = uVar8;
  }
  else {
    plVar10 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = plVar10 + 1;
  }
  psVar1 = (size_t *)*plVar10;
  if (psVar1 == (size_t *)0x0) goto LAB_0013b89f;
  *(size_t *)&(fyt->handle).increment = psVar1[6];
  sVar4 = *psVar1;
  sVar5 = psVar1[1];
  sVar6 = psVar1[2];
  sVar7 = psVar1[3];
  pfVar3 = (fy_input *)psVar1[5];
  (fyt->handle).storage_hint = psVar1[4];
  (fyt->handle).fyi = pfVar3;
  (fyt->handle).end_mark.input_pos = sVar6;
  (fyt->handle).end_mark.line = (int)sVar7;
  (fyt->handle).end_mark.column = (int)(sVar7 >> 0x20);
  (fyt->handle).start_mark.input_pos = sVar4;
  (fyt->handle).start_mark.line = (int)sVar5;
  (fyt->handle).start_mark.column = (int)(sVar5 >> 0x20);
  uVar8 = (uint)uVar9;
  if ((int)type < 0x14) {
    if (type == FYTT_NONE) goto LAB_0013b89f;
    if (type != FYTT_TAG_DIRECTIVE) goto LAB_0013ba7b;
    if (uVar8 < 0x29) {
      ap->gp_offset = uVar8 + 8;
      (fyt->field_9).tag_directive.tag_length = *(uint *)((long)ap->reg_save_area + uVar9);
      if (0x20 < uVar8) goto LAB_0013b9dc;
      puVar11 = (uint *)((ulong)(uVar8 + 8) + (long)ap->reg_save_area);
      ap->gp_offset = uVar8 + 0x10;
    }
    else {
      puVar11 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar11 + 2;
      (fyt->field_9).tag_directive.tag_length = *puVar11;
LAB_0013b9dc:
      puVar11 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar11 + 2;
    }
    (fyt->field_9).tag_directive.uri_length = *puVar11;
    goto LAB_0013ba7b;
  }
  if (type != FYTT_TAG) {
    if (type == FYTT_SCALAR) {
      if (uVar8 < 0x29) {
        puVar11 = (uint *)(uVar9 + (long)ap->reg_save_area);
        ap->gp_offset = uVar8 + 8;
      }
      else {
        puVar11 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar11 + 2;
      }
      uVar8 = *puVar11;
      (fyt->field_9).tag_directive.tag_length = uVar8;
      if (4 < uVar8) goto LAB_0013b89f;
    }
    goto LAB_0013ba7b;
  }
  if (uVar8 < 0x29) {
    ap->gp_offset = (uint)(uVar9 + 8);
    (fyt->field_9).tag_directive.tag_length = *(uint *)((long)ap->reg_save_area + uVar9);
    if (0x20 < uVar8) goto LAB_0013ba28;
    ap->gp_offset = (uint)(uVar9 + 0x10);
    (fyt->field_9).tag_directive.uri_length = *(uint *)((long)ap->reg_save_area + uVar9 + 8);
    if (0x18 < uVar8) goto LAB_0013ba3c;
    ap->gp_offset = uVar8 + 0x18;
    (fyt->field_9).tag.suffix_length = *(uint *)((long)ap->reg_save_area + uVar9 + 0x10);
    if (0x10 < uVar8) goto LAB_0013ba50;
    plVar10 = (long *)((ulong)(uVar8 + 0x18) + (long)ap->reg_save_area);
    ap->gp_offset = uVar8 | 0x20;
  }
  else {
    puVar11 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar11 + 2;
    (fyt->field_9).tag_directive.tag_length = *puVar11;
LAB_0013ba28:
    puVar11 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar11 + 2;
    (fyt->field_9).tag_directive.uri_length = *puVar11;
LAB_0013ba3c:
    puVar11 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar11 + 2;
    (fyt->field_9).tag.suffix_length = *puVar11;
LAB_0013ba50:
    plVar10 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = plVar10 + 1;
  }
  pfVar2 = (fy_token *)*plVar10;
  if (pfVar2 == (fy_token *)0x0) {
LAB_0013b89f:
    fy_token_unref(fyt);
    return (fy_token *)0x0;
  }
  if (pfVar2->refs < 0) {
    __assert_fail("fyt->refs + 1 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                  ,0x4e,"struct fy_token *fy_token_ref(struct fy_token *)");
  }
  pfVar2->refs = pfVar2->refs + 1;
  (fyt->field_9).tag.fyt_td = pfVar2;
LAB_0013ba7b:
  pfVar3 = (fyt->handle).fyi;
  if (pfVar3 != (fy_input *)0x0) {
    fy_input_ref(pfVar3);
    return fyt;
  }
  __assert_fail("fyt->handle.fyi",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                ,0x146,
                "struct fy_token *fy_token_vcreate(enum fy_token_type, struct __va_list_tag *)");
}

Assistant:

struct fy_token *fy_token_vcreate(enum fy_token_type type, va_list ap) {
    struct fy_token *fyt = NULL;
    struct fy_atom *handle;
    struct fy_token *fyt_td;

    if ((unsigned int) type > FYTT_INPUT_MARKER)
        goto err_out;

    fyt = fy_token_alloc();
    if (!fyt)
        goto err_out;
    fyt->type = type;

    handle = va_arg(ap, struct fy_atom *);
    if (!handle)
        goto err_out;
    fyt->handle = *handle;

    switch (fyt->type) {
        case FYTT_TAG_DIRECTIVE:
            fyt->tag_directive.tag_length = va_arg(ap, unsigned int);
            fyt->tag_directive.uri_length = va_arg(ap, unsigned int);
            break;
        case FYTT_SCALAR:
            fyt->scalar.style = va_arg(ap, enum fy_scalar_style);
            if ((unsigned int) fyt->scalar.style >= FYSS_MAX)
                goto err_out;
            break;
        case FYTT_TAG:
            fyt->tag.skip = va_arg(ap, unsigned int);
            fyt->tag.handle_length = va_arg(ap, unsigned int);
            fyt->tag.suffix_length = va_arg(ap, unsigned int);

            fyt_td = va_arg(ap, struct fy_token *);
            if (!fyt_td)
                goto err_out;
            fyt->tag.fyt_td = fy_token_ref(fyt_td);
            break;

        case FYTT_NONE:
            goto err_out;

        default:
            break;
    }

    assert(fyt->handle.fyi);

    /* take reference */
    fy_input_ref(fyt->handle.fyi);

    return fyt;

    err_out:
    fy_token_unref(fyt);

    return NULL;
}